

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O3

bool __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::ConvertToNLCon<mp::LinTerms,mp::AlgConRange>
          (Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *con,int param_2)

{
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  double dVar5;
  double dVar6;
  AlgConRange rng;
  type tVar7;
  bool bVar8;
  CtxVal CVar9;
  ConstraintAcceptanceLevel CVar10;
  CtxVal CVar11;
  anon_union_8_2_43b0091d_for_VarOrConst_1 value;
  byte bVar12;
  int v;
  VarOrConst VVar13;
  NodeRange NVar14;
  NLConstraint nlc;
  LinTerms lt;
  LinearFunctionalConstraint exprTerm;
  int local_414;
  undefined1 local_410 [160];
  inline_storage<int,_6U> iStack_370;
  double local_358;
  double dStack_350;
  int local_348;
  undefined1 local_340 [104];
  type local_2d8;
  type local_2d0;
  undefined1 local_2c0 [24];
  double local_2a8;
  double dStack_2a0;
  NLConstraint local_298;
  undefined1 local_1c8 [72];
  int *local_180;
  ulong local_178;
  size_ty local_170;
  int local_168 [6];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_150;
  ulong local_148;
  ulong local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138 [3];
  type local_108;
  type local_100;
  type local_f8;
  undefined1 local_f0 [24];
  LinearFunctionalConstraint local_d8;
  
  local_1c8._0_8_ = local_1c8 + 0x18;
  local_1c8._8_8_ = 6;
  local_1c8._16_8_ = 0;
  local_178 = 6;
  local_180 = local_168;
  local_170 = 0;
  Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::ExtractLinAndExprArgs
            (&local_d8,
             (Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              *)this,&con->super_LinTerms,(LinTerms *)local_1c8);
  dVar5 = (con->super_AlgConRange).lb_;
  dVar6 = (con->super_AlgConRange).ub_;
  rng = con->super_AlgConRange;
  if (local_d8.affine_expr_.super_LinTerms.coefs_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_size == 1 &&
      local_d8.affine_expr_.constant_term_ == 0.0) {
    if ((*local_d8.affine_expr_.super_LinTerms.coefs_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr != 1.0) ||
       (NAN(*local_d8.affine_expr_.super_LinTerms.coefs_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr))) {
LAB_00307bb5:
      CVar9 = CTX_NEG;
      if (-1e+20 < dVar5) {
        CVar9 = (dVar6 < 1e+20) + 2 + (uint)(dVar6 < 1e+20);
      }
      if (local_d8.super_FunctionalConstraint.ctx.value_ - CTX_ROOT < 2) {
        CVar11 = CTX_MIX;
        if (CVar9 - CTX_NEG < 2) goto LAB_00307c26;
      }
      else {
        CVar11 = CVar9;
        if ((local_d8.super_FunctionalConstraint.ctx.value_ == CTX_NONE) ||
           ((local_d8.super_FunctionalConstraint.ctx.value_ == CTX_NEG &&
            ((CVar11 = CTX_MIX, CVar9 == CTX_MIX || (CVar9 == CTX_POS)))))) {
LAB_00307c26:
          local_d8.super_FunctionalConstraint.ctx.value_ = CVar11;
        }
      }
      VVar13 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               ::AssignResult2Args<mp::LinearFunctionalConstraint>
                         ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                           *)(this + -0x208),&local_d8);
      value = VVar13.field_1;
      if (((undefined1  [16])VVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        NVar14 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                 ::MakeFixedVar((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                                 *)(this + -0x208),value.c_);
        value = (anon_union_8_2_43b0091d_for_VarOrConst_1)NVar14.ir_;
      }
    }
    else {
      value._4_4_ = 0;
      value.var_ = *local_d8.affine_expr_.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
    }
    v = value.var_;
    if (v < 0) goto LAB_00307dc7;
    if ((*(int *)(this + -0x140) - *(int *)(this + -0x150)) * 8 + *(int *)(this + -0x138) <= v) {
      AutoExpand<std::vector<bool,std::allocator<bool>>>
                ((vector<bool,_std::allocator<bool>_> *)(this + -0x150),(ulong)value & 0xffffffff,
                 false);
    }
    CVar10 = BasicConstraintKeeper::GetChosenAcceptanceLevel
                       ((BasicConstraintKeeper *)(this + 0x6e38));
    if (CVar10 != Recommended) {
      AutoExpand<std::vector<bool,std::allocator<bool>>>
                ((vector<bool,_std::allocator<bool>_> *)(this + -0x150),(ulong)value & 0xffffffff,
                 true);
    }
    this_00 = (FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
               *)(this + -0x208);
    bVar8 = FlatModel<mp::DefaultFlatModelParams>::IsProperVar
                      ((FlatModel<mp::DefaultFlatModelParams> *)this_00,v);
    if (!bVar8) goto LAB_00307de3;
    local_410._0_8_ = &DAT_3ff0000000000000;
    local_414 = v;
    gch::detail::small_vector_base<std::allocator<double>,6u>::append_element<double_const&>
              ((small_vector_base<std::allocator<double>,6u> *)local_1c8,(double *)local_410);
    gch::detail::small_vector_base<std::allocator<int>,6u>::append_element<int_const&>
              ((small_vector_base<std::allocator<int>,6u> *)&local_180,&local_414);
    LinTerms::sort_terms((LinTerms *)local_1c8,true);
    if ((ulong)local_1c8._16_8_ < 2) {
      bVar8 = true;
      FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      ::NarrowVarBounds(this_00,v,dVar5,dVar6);
      goto LAB_003080e9;
    }
    CVar10 = BasicConstraintKeeper::GetChosenAcceptanceLevel
                       ((BasicConstraintKeeper *)(this + 0x9d0));
    if (CVar10 != Recommended) {
      v = -1;
      bVar12 = 1;
      goto LAB_00307dc9;
    }
    gch::detail::small_vector_base<std::allocator<double>,6u>::small_vector_base<6u>
              ((small_vector_base<std::allocator<double>,6u> *)&local_150,local_1c8);
    gch::detail::small_vector_base<std::allocator<int>,6u>::small_vector_base<6u>
              ((small_vector_base<std::allocator<int>,6u> *)&local_108,
               (small_vector_base<std::allocator<int>,6u> *)&local_180);
    local_410._48_8_ = local_140;
    dVar5 = (con->super_AlgConRange).lb_;
    dVar6 = (con->super_AlgConRange).ub_;
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_410 + 0x10);
    local_410._8_8_ = 0;
    local_410[0x10] = '\0';
    local_410._0_8_ = paVar1;
    if (local_148 < 7) {
      local_410._32_8_ = local_410 + 0x38;
      local_410._40_8_ = 6;
      if (local_140 != 0) {
        memcpy((void *)local_410._32_8_,local_150,local_140 * 8);
      }
    }
    else {
      local_410._32_8_ = local_150;
      local_410._40_8_ = local_148;
      local_148 = 6;
      local_140 = 0;
      local_150 = local_138;
    }
    tVar7 = local_f8;
    if ((ulong)local_100 < 7) {
      local_410._104_8_ = (long)local_410 + 0x80;
      local_410._112_8_ = (type)0x6;
      if (local_f8 != (type)0x0) {
        memcpy((void *)local_410._104_8_,(void *)local_108,(long)local_f8 * 4);
      }
    }
    else {
      local_410._104_8_ = local_108;
      local_410._112_8_ = local_100;
      local_100 = (type)0x6;
      local_f8 = (type)0x0;
      local_108 = (type)local_f0;
    }
    local_410._120_8_ = tVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._0_8_ == paVar1) {
      local_340._24_8_ = local_410._24_8_;
      local_340._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_340 + 0x10);
    }
    else {
      local_340._0_8_ = local_410._0_8_;
    }
    local_340._17_7_ = local_410._17_7_;
    local_340[0x10] = local_410[0x10];
    local_340._8_8_ = local_410._8_8_;
    local_410._8_8_ = 0;
    local_410[0x10] = '\0';
    local_410._152_8_ = dVar5;
    iStack_370.m_data._0_8_ = dVar6;
    if ((ulong)local_410._40_8_ < 7) {
      local_340._32_8_ = local_340 + 0x38;
      local_340._40_8_ = 6;
      local_410._0_8_ = paVar1;
      if (local_410._48_8_ != 0) {
        memcpy((void *)local_340._32_8_,(void *)local_410._32_8_,local_410._48_8_ * 8);
      }
    }
    else {
      local_340._32_8_ = local_410._32_8_;
      local_340._40_8_ = local_410._40_8_;
      local_410._40_8_ = 6;
      local_410._48_8_ = 0;
      local_410._0_8_ = paVar1;
      local_410._32_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_410 + 0x38);
    }
    if ((ulong)local_410._112_8_ < 7) {
      local_2d8 = (type)((long)local_340 + 0x80);
      local_2d0 = (type)0x6;
      if ((type)local_410._120_8_ != (type)0x0) {
        memcpy((void *)local_2d8,(void *)local_410._104_8_,local_410._120_8_ * 4);
      }
    }
    else {
      local_2d8 = (type)local_410._104_8_;
      local_2d0 = (type)local_410._112_8_;
      local_410._112_8_ = (type)0x6;
      local_410._120_8_ = (type)0x0;
      local_410._104_8_ = (long)local_410 + 0x80;
    }
    local_2a8 = (double)local_410._152_8_;
    dStack_2a0 = (double)iStack_370.m_data._0_8_;
    NVar14 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
             ::
             AddConstraintAndTryNoteResultVariable<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRange>>
                       ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
                         *)this_00,(AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *)local_340);
    FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::AutoLink(this_00,NVar14);
    if (6 < (ulong)local_2d0) {
      operator_delete((void *)local_2d8,(long)local_2d0 << 2);
    }
    if (6 < (ulong)local_340._40_8_) {
      operator_delete((void *)local_340._32_8_,local_340._40_8_ << 3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_340 + 0x10)) {
      operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
    }
    if (6 < (ulong)local_410._112_8_) {
      operator_delete((void *)local_410._104_8_,local_410._112_8_ << 2);
    }
    if (6 < (ulong)local_410._40_8_) {
      operator_delete((void *)local_410._32_8_,local_410._40_8_ << 3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._0_8_ != paVar1) goto LAB_003080da;
  }
  else {
    if (local_d8.affine_expr_.super_LinTerms.coefs_.
        super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0) goto LAB_00307bb5;
    v = -1;
LAB_00307dc7:
    bVar12 = 0;
LAB_00307dc9:
    CVar10 = BasicConstraintKeeper::GetChosenAcceptanceLevel
                       ((BasicConstraintKeeper *)(this + 0x9d0));
    if ((bool)(~bVar12 & CVar10 == Recommended)) {
      bVar8 = false;
      goto LAB_003080e9;
    }
LAB_00307de3:
    NLConstraint::NLConstraint((NLConstraint *)local_410,(LinTerms *)local_1c8,v,rng,false);
    paVar3 = &local_298.super_BasicConstraint.name_.field_2;
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_410 + 0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._0_8_ == paVar1) {
      local_298.super_BasicConstraint.name_.field_2._8_8_ = local_410._24_8_;
      local_298.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_298.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)local_410._0_8_;
    }
    local_298.super_BasicConstraint.name_.field_2._M_allocated_capacity._1_7_ = local_410._17_7_;
    local_298.super_BasicConstraint.name_.field_2._M_local_buf[0] = local_410[0x10];
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_410 + 0x30);
    paVar4 = &local_298.lcr_.super_BasicConstraint.name_.field_2;
    local_298.super_BasicConstraint.name_._M_string_length = local_410._8_8_;
    local_410._8_8_ = 0;
    local_410[0x10] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._32_8_ == paVar2) {
      local_298.lcr_.super_BasicConstraint.name_.field_2._8_8_ = local_410._56_8_;
      local_298.lcr_.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      local_298.lcr_.super_BasicConstraint.name_._M_dataplus._M_p = (pointer)local_410._32_8_;
    }
    local_298.lcr_.super_BasicConstraint.name_.field_2._M_allocated_capacity = local_410._48_8_;
    local_298.lcr_.super_BasicConstraint.name_._M_string_length = local_410._40_8_;
    local_410._40_8_ = 0;
    local_410._48_8_ = local_410._48_8_ & 0xffffffffffffff00;
    local_410._0_8_ = paVar1;
    local_410._32_8_ = paVar2;
    if ((ulong)local_410._72_8_ < 7) {
      local_298.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
      m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           (ptr)((long)&local_298.lcr_.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data + 0x18);
      local_298.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
      m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
      if (local_410._80_8_ != 0) {
        memcpy(local_298.lcr_.super_LinTerms.coefs_.
               super_small_vector_base<std::allocator<double>,_6U>.m_data.
               super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
               (void *)local_410._64_8_,local_410._80_8_ * 8);
      }
    }
    else {
      local_298.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
      m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
           (ptr)local_410._64_8_;
      local_298.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
      m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = local_410._72_8_;
      local_410._72_8_ = 6;
      local_410._80_8_ = 0;
      local_410._64_8_ = (inline_storage<double,_6U> *)(local_410 + 0x58);
    }
    if ((ulong)local_410._144_8_ < 7) {
      local_298.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
           (ptr)((long)&local_298.lcr_.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data + 0x18);
      local_298.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
      if ((double)local_410._152_8_ != 0.0) {
        memcpy(local_298.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
               m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
               (void *)local_410._136_8_,local_410._152_8_ * 4);
      }
    }
    else {
      local_298.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr = (ptr)local_410._136_8_;
      local_298.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = local_410._144_8_;
      local_410._144_8_ = 6;
      local_410._152_8_ = 0.0;
      local_410._136_8_ = &iStack_370;
    }
    local_298.lcr_.super_AlgConRange.lb_ = local_358;
    local_298.lcr_.super_AlgConRange.ub_ = dStack_350;
    local_298.expr_ = local_348;
    NVar14 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             ::AddConstraintAndTryNoteResultVariable<mp::NLConstraint>
                       ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                         *)(this + -0x208),&local_298);
    FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::AutoLink((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                *)(this + -0x208),NVar14);
    if (6 < local_298.lcr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
            m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
      operator_delete(local_298.lcr_.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                      local_298.lcr_.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data.
                      super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
    }
    if (6 < local_298.lcr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>
            .m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
      operator_delete(local_298.lcr_.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                      local_298.lcr_.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data.
                      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.lcr_.super_BasicConstraint.name_._M_dataplus._M_p != paVar4) {
      operator_delete(local_298.lcr_.super_BasicConstraint.name_._M_dataplus._M_p,
                      local_298.lcr_.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.super_BasicConstraint.name_._M_dataplus._M_p != paVar3) {
      operator_delete(local_298.super_BasicConstraint.name_._M_dataplus._M_p,
                      local_298.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
    }
    if (6 < (ulong)local_410._144_8_) {
      operator_delete((void *)local_410._136_8_,local_410._144_8_ << 2);
    }
    if (6 < (ulong)local_410._72_8_) {
      operator_delete((void *)local_410._64_8_,local_410._72_8_ << 3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._32_8_ != paVar2) {
      operator_delete((void *)local_410._32_8_,local_410._48_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._0_8_ != paVar1) {
LAB_003080da:
      operator_delete((void *)local_410._0_8_,CONCAT71(local_410._17_7_,local_410[0x10]) + 1);
    }
  }
  bVar8 = true;
LAB_003080e9:
  if (6 < local_d8.affine_expr_.super_LinTerms.vars_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_d8.affine_expr_.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_d8.affine_expr_.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_d8.affine_expr_.super_LinTerms.coefs_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_d8.affine_expr_.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_d8.affine_expr_.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p !=
      &local_d8.super_FunctionalConstraint.super_BasicConstraint.name_.field_2) {
    operator_delete(local_d8.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p
                    ,local_d8.super_FunctionalConstraint.super_BasicConstraint.name_.field_2.
                     _M_allocated_capacity + 1);
  }
  if (6 < local_178) {
    operator_delete(local_180,local_178 << 2);
  }
  if (6 < (ulong)local_1c8._8_8_) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._8_8_ << 3);
  }
  return bVar8;
}

Assistant:

bool ConvertToNLCon(
      const AlgebraicConstraint<Body, RhsOrRange>& con, int ) {
    LinTerms lt;
    /// exprTerm will be a LinearFunctionalConstraint or a Quadratic...
    auto exprTerm = ExtractLinAndExprArgs(con.GetBody(), lt);
    assert(0.0 == exprTerm.GetArguments().constant_term());
    AlgConRange rng { con.GetRhsOrRange().lb(), con.GetRhsOrRange().ub() };
    /// Store full LFC only if it is not 1.0*var
    int exprResVar = -1;
    if (exprTerm.GetArguments().is_variable()) {
      exprResVar = exprTerm.GetArguments().get_representing_variable();
    } else if ( !exprTerm.GetArguments().empty() ) {  // has more terms, or coef != 1.0
      exprTerm.AddContext(                            // Context is compulsory
          rng.lb() > MPCD( PracticallyMinusInf() )    // Should not need to propagate
          ? (rng.ub() < MPCD( PracticallyInf() )
                ? Context::CTX_MIX : Context::CTX_POS)
              : Context::CTX_NEG);
      exprResVar = MPD( AssignResultVar2Args(std::move(exprTerm)) );
    }
    bool need_nlc {false};
    if (exprResVar >= 0) {                            // Some expressions are there
      if (!MPCD(VarHasMarking(exprResVar)))             // mark as expr if new
        MPD( MarkAsExpression(exprResVar) );
      if ( !MPCD( UserAcceptsAndRecommends((const NLConstraint*)nullptr) ) )
        MPD( MarkAsResultVar(exprResVar) );
      /// Exists and marked a variable
      if (MPCD( IsProperVar(exprResVar) )) {            // Not an expression after all
        lt.add_term(1.0, exprResVar);        // @todo When exprTerm was originally a var,
        lt.sort_terms();                     // this would reproduce the original con.
        if (lt.size()>1) {                              // ... has other variables
          if (MPCD( UserAcceptsAndRecommends(       // Accepts LinCon..
                  (const AlgebraicConstraint<LinTerms, RhsOrRange>*)nullptr) )) {
            AlgebraicConstraint<LinTerms, RhsOrRange> lc {lt, con.GetRhsOrRange(), false};
            MPD( AddConstraint( std::move(lc) ) );
            return true;
          }
          need_nlc = true;
        } else {         // single variable, its expression will be explicified
          MPD( NarrowVarBounds(exprResVar, rng.lb(), rng.ub()) );
          return true;
        }
        exprResVar = -1;                                // no expression
      }
    }
    if (0<=exprResVar                                   // either: have expression
        || !MPCD( UserAcceptsAndRecommends(         // or, not accepts source \a con
            (const AlgebraicConstraint<Body, RhsOrRange>*)nullptr) )
        || need_nlc) {                                  // or, other reason
      assert( MPCD( UserAcceptsAndRecommends((const NLConstraint*)nullptr) ) );
      NLConstraint nlc{lt, exprResVar, rng, false};     // false: no sort any more
      MPD( AddConstraint( std::move(nlc) ) );
      return true;
    }
    return false;
  }